

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibraryBase::Finalize(JavascriptLibraryBase *this,bool isShutdown)

{
  ScriptContext *pSVar1;
  
  pSVar1 = (this->scriptContext).ptr;
  if (pSVar1 != (ScriptContext *)0x0) {
    (pSVar1->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next =
         &(pSVar1->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>;
    (pSVar1->weakReferenceDictionaryList).super_RealCount.count = 0;
    pSVar1 = (this->scriptContext).ptr;
    pSVar1->isFinalized = true;
    ScriptContext::MarkForClose(pSVar1);
    pSVar1 = (this->scriptContext).ptr;
    if ((pSVar1->prev != (ScriptContext *)0x0 || pSVar1->next != (ScriptContext *)0x0) ||
       (pSVar1->threadContext->scriptContextList == pSVar1)) {
      ThreadContext::UnregisterScriptContext(pSVar1->threadContext,pSVar1);
      return;
    }
  }
  return;
}

Assistant:

void JavascriptLibraryBase::Finalize(bool isShutdown)
    {
        if (scriptContext)
        {
            // Clear the weak reference dictionary so we don't need to clean them
            // during PostCollectCallBack before Dispose deleting the script context.
            scriptContext->ResetWeakReferenceDictionaryList();
            scriptContext->SetIsFinalized();
            scriptContext->MarkForClose();
            if (scriptContext->IsRegistered())
            {
                scriptContext->GetThreadContext()->UnregisterScriptContext(scriptContext);
            }
        }
    }